

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cc
# Opt level: O2

void __thiscall SDL2pp::Exception::Exception(Exception *this,char *function)

{
  char *pcVar1;
  char *in_RCX;
  string sStack_38;
  
  pcVar1 = (char *)SDL_GetError();
  make_what_abi_cxx11_(&sStack_38,(Exception *)function,pcVar1,in_RCX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)this = &PTR__Exception_0010fd48;
  std::__cxx11::string::string((string *)&this->sdl_function_,function,(allocator *)&sStack_38);
  pcVar1 = (char *)SDL_GetError();
  std::__cxx11::string::string((string *)&this->sdl_error_,pcVar1,(allocator *)&sStack_38);
  return;
}

Assistant:

Exception::Exception(const char* function)
	: std::runtime_error(make_what(function, SDL_GetError())),
	  sdl_function_(function),
	  sdl_error_(SDL_GetError()) {
}